

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int __thiscall
CVmObjDate::add_val(CVmObjDate *this,vm_val_t *result,vm_obj_id_t param_2,vm_val_t *val)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  int32_t iVar5;
  int daytime;
  double dVar6;
  double d_00;
  ldiv_t lVar7;
  bignum_t<32> d;
  bignum_t<32> result_1;
  bignum_t<32> result_2;
  bignum_t<32> local_88;
  char local_72 [4];
  undefined1 local_6e;
  char local_5c [4];
  undefined1 local_58;
  char local_46 [4];
  undefined1 local_42;
  
  piVar2 = (int *)(this->super_CVmObject).ext_;
  iVar1 = *piVar2;
  daytime = piVar2[1];
  if (val->typ == VM_INT) {
    iVar5 = iVar1 + (val->val).obj;
  }
  else {
    local_88.ext[0] = ' ';
    local_88.ext[1] = '\0';
    local_88.ext[4] = '\0';
    bignum_t<32>::set(&local_88,val);
    dVar6 = CVmObjBigNum::ext_to_double(local_88.ext);
    dVar6 = floor(dVar6);
    if ((2147483647.0 < (double)iVar1 + dVar6) || ((double)iVar1 + dVar6 < -2147483648.0)) {
      err_throw(0x7e7);
    }
    local_72[0] = ' ';
    local_72[1] = '\0';
    local_6e = 0;
    CVmObjBigNum::set_double_val(local_72,dVar6);
    local_5c[0] = ' ';
    local_5c[1] = '\0';
    local_58 = 0;
    CVmObjBigNum::compute_diff_into(local_5c,local_88.ext,local_72);
    local_72[0] = ' ';
    local_72[1] = '\0';
    local_6e = 0;
    CVmObjBigNum::set_int_val(local_72,86400000);
    local_46[0] = ' ';
    local_46[1] = '\0';
    local_42 = 0;
    CVmObjBigNum::compute_prod_into(local_46,local_5c,local_72);
    d_00 = CVmObjBigNum::ext_to_double(local_46);
    iVar5 = round_int32(d_00);
    lVar7 = ldiv((long)(iVar5 + daytime),86400000);
    iVar3 = (int)lVar7.rem;
    iVar5 = (iVar3 >> 0x1f) + (int)lVar7.quot + iVar1 + (int)dVar6;
    daytime = iVar3 + 86400000;
    if (-1 < iVar3) {
      daytime = iVar3;
    }
  }
  vVar4 = create(0,iVar5,daytime);
  result->typ = VM_OBJ;
  (result->val).obj = vVar4;
  return 1;
}

Assistant:

int CVmObjDate::add_val(VMG_ vm_val_t *result, vm_obj_id_t /*self*/,
                        const vm_val_t *val)
{
    /* get my date and time */
    int32_t dayno = get_ext()->dayno;
    int32_t daytime = get_ext()->daytime;
    
    /* the other value must be something numeric */
    if (val->typ == VM_INT)
    {
        /* it's a simple integer - add it as a number of days */
        dayno += val->val.intval;
    }
    else
    {
        /* it's not an int; calculate in the bignum domain */
        bignum_t<32>d(vmg_ val);

        /* make sure the integer portion won't overflow */
        double dd = floor((double)d);
        if (dd + dayno > INT32MAXVAL || dd + dayno < INT32MINVAL)
            err_throw(VMERR_NUM_OVERFLOW);

        /* add the whole part to my day number */
        dayno += (int32_t)dd;

        /* 
         *   convert the fractional part to milliseconds (by multiplying it
         *   by the number of milliseconds in a day), then add it to my time
         *   value 
         */
        daytime += round_int32((double)((d - dd) * (long)(24L*60*60*1000)));

        /* normalize, to carry time overflow/underflow into the date */
        caldate_t::normalize(dayno, daytime);
    }

    /* return a new Date object representing the result */
    result->set_obj(create(vmg_ FALSE, dayno, daytime));

    /* handled */
    return TRUE;
}